

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string * __thiscall
cs_impl::any::holder<cs::numeric>::to_string_abi_cxx11_(holder<cs::numeric> *this)

{
  string *in_RDI;
  numeric *in_stack_000001d8;
  
  to_string<cs::numeric>(in_stack_000001d8);
  return in_RDI;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}